

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::VMContext::withInterpreter(VMContext *this,WithInterpreterBlock *block)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<void_(Lodtalk::StackMemory_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackInterpreter.cpp:2350:27)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(Lodtalk::StackMemory_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackInterpreter.cpp:2350:27)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  local_28._8_8_ = block;
  withStackMemory(this,(StackMemoryEntry *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void VMContext::withInterpreter(const WithInterpreterBlock &block)
{
    withStackMemory(this, [&](StackMemory *stack) {
		StackInterpreter interpreter(this, stack);
        StackInterpreterProxy proxy(&interpreter);
		block(&proxy);
	});

}